

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int i2cWriteBlockData(uint handle,uint reg,char *buf,uint count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int status;
  int i;
  my_smbus_data data;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  uint count_00;
  my_smbus_data *in_stack_ffffffffffffff80;
  FILE *pFVar6;
  undefined8 in_stack_ffffffffffffff88;
  int size;
  undefined8 in_stack_ffffffffffffff90;
  uint local_44;
  undefined1 local_3e [34];
  uint local_1c;
  long local_18;
  uint local_c;
  uint local_8;
  uint local_4;
  
  pFVar6 = _stderr;
  count_00 = (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  size = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar4 = myTimeStamp();
    uVar3 = local_8;
    uVar2 = local_c;
    uVar1 = local_1c;
    pcVar5 = myBuf2Str(count_00,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48
                                                ));
    fprintf(pFVar6,"%s %s: handle=%d reg=%d count=%d [%s]\n",pcVar4,"i2cWriteBlockData",(ulong)uVar3
            ,(ulong)uVar2,uVar1,pcVar5);
  }
  pFVar6 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar4 = myTimeStamp();
      fprintf(pFVar6,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar4,
              "i2cWriteBlockData");
    }
    local_4 = 0xffffffe1;
  }
  else if (local_8 < 0x40) {
    if (i2cInfo[local_8].state == 2) {
      if ((i2cInfo[local_8].funcs & 0x2000000) == 0) {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar4 = myTimeStamp();
          fprintf(pFVar6,"%s %s: SMBUS command not supported by driver\n",pcVar4,"i2cWriteBlockData"
                 );
        }
        local_4 = 0xffffff95;
      }
      else if (local_c < 0x100) {
        if ((local_1c == 0) || (0x20 < local_1c)) {
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar4 = myTimeStamp();
            fprintf(pFVar6,"%s %s: bad count (%d)\n",pcVar4,"i2cWriteBlockData",(ulong)local_1c);
          }
          local_4 = 0xffffffaf;
        }
        else {
          for (local_44 = 1; local_44 <= local_1c; local_44 = local_44 + 1) {
            local_3e[(int)local_44] = *(undefined1 *)(local_18 + (int)(local_44 - 1));
          }
          local_3e[0] = (undefined1)local_1c;
          local_4 = my_smbus_access((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                    (char)((ulong)in_stack_ffffffffffffff90 >> 0x18),
                                    (uint8_t)((ulong)in_stack_ffffffffffffff90 >> 0x10),size,
                                    in_stack_ffffffffffffff80);
          pFVar6 = _stderr;
          if ((int)local_4 < 0) {
            if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar6,"%s %s: error=%d (%m)\n",pcVar4,"i2cWriteBlockData",(ulong)local_4);
            }
            local_4 = 0xffffffae;
          }
        }
      }
      else {
        if ((gpioCfg.internals & 0x400) == 0) {
          pcVar4 = myTimeStamp();
          fprintf(pFVar6,"%s %s: bad reg (%d)\n",pcVar4,"i2cWriteBlockData",(ulong)local_c);
        }
        local_4 = 0xffffffaf;
      }
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar4 = myTimeStamp();
        fprintf(pFVar6,"%s %s: bad handle (%d)\n",pcVar4,"i2cWriteBlockData",(ulong)local_8);
      }
      local_4 = 0xffffffe7;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar4 = myTimeStamp();
      fprintf(pFVar6,"%s %s: bad handle (%d)\n",pcVar4,"i2cWriteBlockData",(ulong)local_8);
    }
    local_4 = 0xffffffe7;
  }
  return local_4;
}

Assistant:

int i2cWriteBlockData(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   union my_smbus_data data;

   int i, status;

   DBG(DBG_USER, "handle=%d reg=%d count=%d [%s]",
      handle, reg, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BLOCK_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   if ((count < 1) || (count > 32))
      SOFT_ERROR(PI_BAD_PARAM, "bad count (%d)", count);

   for (i=1; i<=count; i++) data.block[i] = buf[i-1];
   data.block[0] = count;

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            reg,
            PI_I2C_SMBUS_BLOCK_DATA,
            &data);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}